

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O2

int ConnectRoboteq(ROBOTEQ *pRoboteq,char *szCfgFilePath)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long local_290;
  char line [256];
  char response [256];
  
  memset(pRoboteq->szCfgFilePath,0,0x100);
  sprintf(pRoboteq->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar4 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar4 != 0) {
    memset(line,0,0x100);
    memset(pRoboteq->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRoboteq->szDevPath,"COM1",5);
    pRoboteq->BaudRate = 0x2580;
    pRoboteq->timeout = 1000;
    pRoboteq->threadperiod = 100;
    pRoboteq->bSaveRawData = 1;
    pRoboteq->bEcho = 1;
    for (lVar5 = -0xc; lVar5 != 0; lVar5 = lVar5 + 4) {
      *(undefined4 *)((long)pRoboteq->MidPWs + lVar5) = 1000;
      *(undefined4 *)((long)pRoboteq->MaxPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->InitPWs + lVar5) = 2000;
      *(undefined4 *)((long)pRoboteq->ThresholdPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->CoefPWs + lVar5 + -4) = 0;
      *(undefined8 *)((long)pRoboteq->bProportionalPWs + lVar5 * 2) = 0x3ff0000000000000;
      *(undefined4 *)((long)pRoboteq->analoginputoffset + lVar5 + -4) = 1;
    }
    for (lVar5 = -0x40; lVar5 != 0; lVar5 = lVar5 + 8) {
      *(undefined8 *)((long)pRoboteq->analoginputthreshold + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputcoef + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputx + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)pRoboteq->analoginputy + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputz + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputphi + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputtheta + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputpsi + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputmin + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputmax + lVar5) = 0;
      *(undefined8 *)((long)pRoboteq->analoginputmax + lVar5 + 0x40) = 0;
    }
    pRoboteq->rudderchan = 2;
    pRoboteq->rightthrusterchan = 1;
    pRoboteq->leftthrusterchan = 0;
    pRoboteq->vbat1analoginputchan = -1;
    pRoboteq->ibat1analoginputchan = -1;
    pRoboteq->vbat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->vbat3analoginputchan = -1;
    pRoboteq->ibat3analoginputchan = -1;
    pRoboteq->switchanaloginputchan = -1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar6 = "Configuration file not found.";
    }
    else {
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%255s",pRoboteq->szDevPath);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->BaudRate);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->timeout);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->threadperiod);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->bSaveRawData);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->bEcho);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      local_290 = 0x5a0;
      for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->MinPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->MidPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->MaxPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->InitPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->ThresholdPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(pRoboteq->RS232Port).szDevPath + local_290 + -0x10);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pRoboteq->bProportionalPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        local_290 = local_290 + 8;
      }
      for (lVar5 = 0; pcVar6 = fgets3((FILE *)__stream,line,0x100), lVar5 != 0x40; lVar5 = lVar5 + 8
          ) {
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputoffset + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputthreshold + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputcoef + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputx + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputy + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputz + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputphi + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputtheta + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputpsi + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputmin + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(long)pRoboteq->analoginputmax + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
      }
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->rudderchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->rightthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->leftthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->vbat1analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->ibat1analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->vbat2analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->ibat2analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->vbat3analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->ibat3analoginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pRoboteq->switchanaloginputchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      iVar4 = fclose(__stream);
      if (iVar4 == 0) goto LAB_00179abe;
      pcVar6 = "fclose() failed.";
    }
    puts(pcVar6);
  }
LAB_00179abe:
  if (pRoboteq->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRoboteq->threadperiod = 100;
  }
  uVar8 = 0;
  do {
    if (uVar8 == 3) {
      for (lVar5 = 200; lVar5 != 0xcb; lVar5 = lVar5 + 1) {
        pcVar6 = (pRoboteq->RS232Port).szDevPath + lVar5 * 4 + -0x10;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      for (lVar5 = 0xcb; lVar5 != 0xd3; lVar5 = lVar5 + 1) {
        pcVar6 = (pRoboteq->RS232Port).szDevPath + lVar5 * 4 + -0x10;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      if (2 < (uint)pRoboteq->rudderchan) {
        puts("Invalid parameter : rudderchan.");
        pRoboteq->rudderchan = 2;
      }
      if (2 < (uint)pRoboteq->rightthrusterchan) {
        puts("Invalid parameter : rightthrusterchan.");
        pRoboteq->rightthrusterchan = 1;
      }
      if (2 < (uint)pRoboteq->leftthrusterchan) {
        puts("Invalid parameter : leftthrusterchan.");
        pRoboteq->leftthrusterchan = 0;
      }
      if (pRoboteq->vbat1analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : vbat1analoginputchan.");
        pRoboteq->vbat1analoginputchan = -1;
      }
      if (pRoboteq->ibat1analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : ibat1analoginputchan.");
        pRoboteq->ibat1analoginputchan = -1;
      }
      if (pRoboteq->vbat2analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : vbat2analoginputchan.");
        pRoboteq->vbat2analoginputchan = -1;
      }
      if (pRoboteq->ibat2analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : ibat2analoginputchan.");
        pRoboteq->ibat2analoginputchan = -1;
      }
      if (pRoboteq->vbat3analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : vbat3analoginputchan.");
        pRoboteq->vbat3analoginputchan = -1;
      }
      if (pRoboteq->ibat3analoginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : ibat3analoginputchan.");
        pRoboteq->ibat3analoginputchan = -1;
      }
      if (pRoboteq->switchanaloginputchan - 8U < 0xfffffff7) {
        puts("Invalid parameter : switchanaloginputchan.");
        pRoboteq->switchanaloginputchan = -1;
      }
      iVar4 = OpenRS232Port(&pRoboteq->RS232Port,pRoboteq->szDevPath);
      if (iVar4 == 0) {
        iVar4 = SetOptionsRS232Port(&pRoboteq->RS232Port,pRoboteq->BaudRate,'\0',0,'\b','\0',
                                    pRoboteq->timeout);
        if (iVar4 == 0) {
          iVar4 = IssueCommandRoboteq(pRoboteq,"?","FID","",10,response,0);
          if (iVar4 == 0) {
            sVar7 = strlen(response);
            if (sVar7 < 0xc) {
              puts("Warning : A Roboteq has an unrecognized version.");
            }
            puts("Roboteq connected.");
            return 0;
          }
          pcVar6 = "Unable to connect to a Roboteq : FID failure.";
        }
        else {
          pcVar6 = "Unable to connect to a Roboteq.";
        }
        puts(pcVar6);
        CloseRS232Port(&pRoboteq->RS232Port);
      }
      else {
        puts("Unable to connect to a Roboteq.");
      }
      return 1;
    }
    uVar1 = pRoboteq->MinPWs[uVar8];
    if (((uVar1 - 0x9c5 < 0xfffff82f) ||
        (uVar2 = pRoboteq->MidPWs[uVar8], uVar2 - 0x9c5 < 0xfffff82f)) ||
       (uVar3 = pRoboteq->MaxPWs[uVar8], uVar3 - 0x9c5 < 0xfffff82f)) {
LAB_00179b38:
      printf("Invalid parameters : PWM channel %d.\n",uVar8 & 0xffffffff);
      pRoboteq->MinPWs[uVar8] = 1000;
      pRoboteq->MidPWs[uVar8] = 0x5dc;
      pRoboteq->MaxPWs[uVar8] = 2000;
      pRoboteq->InitPWs[uVar8] = 0x5dc;
      pRoboteq->ThresholdPWs[uVar8] = 0;
      pRoboteq->CoefPWs[uVar8] = 1.0;
      pRoboteq->bProportionalPWs[uVar8] = 1;
    }
    else {
      iVar4 = pRoboteq->InitPWs[uVar8];
      if (iVar4 != 0) {
        if (((uVar2 <= uVar3) && (uVar1 <= uVar2)) &&
           ((iVar4 <= (int)uVar3 && (((int)uVar1 <= iVar4 && (0xfffff82e < iVar4 - 0x9c5U))))))
        goto LAB_00179bd3;
        goto LAB_00179b38;
      }
      if (uVar3 < uVar2 || uVar2 < uVar1) goto LAB_00179b38;
LAB_00179bd3:
      if (pRoboteq->ThresholdPWs[uVar8] < 0) goto LAB_00179b38;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

inline int ConnectRoboteq(ROBOTEQ* pRoboteq, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;
	char response[256];

	memset(pRoboteq->szCfgFilePath, 0, sizeof(pRoboteq->szCfgFilePath));
	sprintf(pRoboteq->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRoboteq->szDevPath, 0, sizeof(pRoboteq->szDevPath));
		sprintf(pRoboteq->szDevPath, "COM1");
		pRoboteq->BaudRate = 9600;
		pRoboteq->timeout = 1000;
		pRoboteq->threadperiod = 100;
		pRoboteq->bSaveRawData = 1;
		pRoboteq->bEcho = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
		{
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
		for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
		{
			pRoboteq->analoginputoffset[channel] = 0;
			pRoboteq->analoginputthreshold[channel] = 0;
			pRoboteq->analoginputcoef[channel] = 1;
			pRoboteq->analoginputx[channel] = 0;
			pRoboteq->analoginputy[channel] = 0;
			pRoboteq->analoginputz[channel] = 0;
			pRoboteq->analoginputphi[channel] = 0;
			pRoboteq->analoginputtheta[channel] = 0;
			pRoboteq->analoginputpsi[channel] = 0;
			pRoboteq->analoginputmin[channel] = 0;
			pRoboteq->analoginputmax[channel] = 0;
		}
		pRoboteq->rudderchan = 2;
		pRoboteq->rightthrusterchan = 1;
		pRoboteq->leftthrusterchan = 0;
		pRoboteq->vbat1analoginputchan = -1;
		pRoboteq->ibat1analoginputchan = -1;
		pRoboteq->vbat2analoginputchan = -1;
		pRoboteq->ibat2analoginputchan = -1;
		pRoboteq->vbat3analoginputchan = -1;
		pRoboteq->ibat3analoginputchan = -1;
		pRoboteq->switchanaloginputchan = -1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRoboteq->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bEcho) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputoffset[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputthreshold[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputcoef[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputx[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputy[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputz[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputphi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputtheta[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputpsi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmin[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmax[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rudderchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->switchanaloginputchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRoboteq->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRoboteq->threadperiod = 100;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (
			(pRoboteq->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)
			||(
			(pRoboteq->InitPWs[channel] != 0)&&
			((pRoboteq->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MinPWs[channel] > pRoboteq->InitPWs[channel])||(pRoboteq->InitPWs[channel] > pRoboteq->MaxPWs[channel]))			
			)||
			(pRoboteq->MinPWs[channel] > pRoboteq->MidPWs[channel])||(pRoboteq->MidPWs[channel] > pRoboteq->MaxPWs[channel])||
			(pRoboteq->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : PWM channel %d.\n", channel);
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
	}

	// Used to save raw data, should be handled specifically...
	//pRoboteq->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		pRoboteq->LastPWs[channel] = 0;
	}

	for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
	{
		pRoboteq->LastAIs[channel] = 0;
	}

	if ((pRoboteq->rudderchan < 0)||(pRoboteq->rudderchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rudderchan.\n");
		pRoboteq->rudderchan = 2;
	}
	if ((pRoboteq->rightthrusterchan < 0)||(pRoboteq->rightthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pRoboteq->rightthrusterchan = 1;
	}
	if ((pRoboteq->leftthrusterchan < 0)||(pRoboteq->leftthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pRoboteq->leftthrusterchan = 0;
	}

	if ((pRoboteq->vbat1analoginputchan < -1)||(pRoboteq->vbat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat1analoginputchan.\n");
		pRoboteq->vbat1analoginputchan = -1;
	}
	if ((pRoboteq->ibat1analoginputchan < -1)||(pRoboteq->ibat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat1analoginputchan.\n");
		pRoboteq->ibat1analoginputchan = -1;
	}
	if ((pRoboteq->vbat2analoginputchan < -1)||(pRoboteq->vbat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat2analoginputchan.\n");
		pRoboteq->vbat2analoginputchan = -1;
	}
	if ((pRoboteq->ibat2analoginputchan < -1)||(pRoboteq->ibat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat2analoginputchan.\n");
		pRoboteq->ibat2analoginputchan = -1;
	}
	if ((pRoboteq->vbat3analoginputchan < -1)||(pRoboteq->vbat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat3analoginputchan.\n");
		pRoboteq->vbat3analoginputchan = -1;
	}
	if ((pRoboteq->ibat3analoginputchan < -1)||(pRoboteq->ibat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat3analoginputchan.\n");
		pRoboteq->ibat3analoginputchan = -1;
	}
	if ((pRoboteq->switchanaloginputchan < -1)||(pRoboteq->switchanaloginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : switchanaloginputchan.\n");
		pRoboteq->switchanaloginputchan = -1;
	}

	if (OpenRS232Port(&pRoboteq->RS232Port, pRoboteq->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRoboteq->RS232Port, pRoboteq->BaudRate, NOPARITY, FALSE, 8,
		ONESTOPBIT, (UINT)pRoboteq->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "?", "FID", "", 10, response, FALSE) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq : FID failure.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}
	if (strlen(response) < 12)
	{
		printf("Warning : A Roboteq has an unrecognized version.\n");
	}

	printf("Roboteq connected.\n");

	return EXIT_SUCCESS;
}